

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-read-bits.h
# Opt level: O2

int read_bits(coda_product *product,int64_t bit_offset,int64_t bit_length,uint8_t *dst)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined1 auVar5 [16];
  int iVar6;
  sbyte sVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long length;
  uint8_t *puVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  uint8_t buffer_1;
  undefined4 local_50;
  uint8_t buffer [4];
  undefined1 auVar15 [16];
  
  uVar8 = (ulong)((uint)bit_offset & 7);
  lVar9 = uVar8 + bit_length;
  uVar13 = -(int)lVar9 & 7;
  lVar10 = bit_offset >> 3;
  sVar7 = (sbyte)uVar13;
  if (lVar9 < 9) {
    iVar6 = read_bytes(product,lVar10,1,dst);
    if (iVar6 != 0) {
      return -1;
    }
    if (uVar13 != 0) {
      *dst = *dst >> sVar7;
    }
    if ((bit_length & 7U) != 0) {
      *dst = *dst & ~(byte)(-1 << ((byte)bit_length & 0x1f));
    }
  }
  else if (uVar13 == 0) {
    uVar8 = bit_length & 7;
    if (uVar8 != 0) {
      iVar6 = read_bytes(product,lVar10,1,&buffer_1);
      if (iVar6 != 0) {
        return -1;
      }
      *dst = ~(-1 << (sbyte)uVar8) & buffer_1;
      dst = dst + 1;
      bit_offset = bit_offset + uVar8;
      bit_length = bit_length & 0xfffffffffffffff8;
    }
    if ((0 < bit_length) &&
       (iVar6 = read_bytes(product,bit_offset >> 3,(ulong)bit_length >> 3,dst), iVar6 != 0)) {
      return -1;
    }
  }
  else {
    uVar11 = bit_length % 0x18;
    if (uVar11 != 0) {
      uVar8 = uVar8 + uVar11;
      length = ((uVar8 >> 3) + 1) - (ulong)((uVar8 & 7) == 0);
      lVar9 = ((uVar11 >> 3) + 1) - (ulong)((uVar11 & 7) == 0);
      puVar12 = buffer;
      iVar6 = read_bytes(product,lVar10,length,puVar12);
      if (iVar6 != 0) {
        return -1;
      }
      local_50 = 0;
      for (lVar10 = 0; -lVar10 != length; lVar10 = lVar10 + -1) {
        buffer[lVar10 + -1] = *puVar12;
        puVar12 = puVar12 + 1;
      }
      local_50 = ~(-1 << ((byte)uVar11 & 0x1f)) & 0U >> (sVar7 + (char)length * -8 & 0x1fU);
      puVar12 = dst;
      lVar10 = lVar9;
      while (lVar10 != 0) {
        *puVar12 = (&buffer_1)[lVar10];
        puVar12 = puVar12 + 1;
        lVar10 = lVar10 + -1;
      }
      dst = dst + lVar9;
      bit_offset = bit_offset + uVar11;
      bit_length = bit_length - uVar11;
    }
    for (; 0 < bit_length; bit_length = bit_length + -0x18) {
      iVar6 = read_bytes(product,bit_offset >> 3,4,buffer);
      if (iVar6 != 0) {
        return -1;
      }
      auVar5._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
      auVar5[0] = buffer[3];
      auVar5._10_6_ = 0;
      auVar15._5_11_ = SUB1611(auVar5 << 0x30,5);
      auVar15[4] = buffer[2];
      auVar15[0] = buffer[0];
      auVar15[1] = buffer[1];
      auVar15[2] = buffer[2];
      auVar15[3] = buffer[3];
      auVar16._12_4_ = 0;
      auVar16._0_12_ = auVar15._4_12_;
      auVar14._3_13_ = SUB1613(auVar16 << 0x20,3);
      auVar14[2] = buffer[1];
      auVar14[0] = buffer[0];
      auVar14[1] = 0;
      auVar16 = pshuflw(auVar14,auVar14,0x1b);
      sVar1 = auVar16._0_2_;
      sVar2 = auVar16._2_2_;
      sVar3 = auVar16._4_2_;
      sVar4 = auVar16._6_2_;
      local_50 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar16[6] - (0xff < sVar4),
                          CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar16[4] - (0xff < sVar3),
                                   CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar16[2] -
                                            (0xff < sVar2),
                                            (0 < sVar1) * (sVar1 < 0x100) * auVar16[0] -
                                            (0xff < sVar1)))) >> sVar7;
      *dst = (uint8_t)(local_50 >> 0x10);
      dst[1] = (uint8_t)(local_50 >> 8);
      dst[2] = (uint8_t)local_50;
      dst = dst + 3;
      bit_offset = bit_offset + 0x18;
    }
  }
  return 0;
}

Assistant:

static int read_bits(coda_product *product, int64_t bit_offset, int64_t bit_length, uint8_t *dst)
{
    unsigned long bit_shift;
    int64_t padded_bit_length;

    /* we read bits by treating them as big endian numbers.
     * This means that
     *
     *      src[0]     |    src[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  . . a b c d e f|g h i j k . . .
     *
     * will be read and shifted to get
     *
     *      dst[0]     |    dst[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  . . . . . a b c|d e f g h i j k
     * 
     * If the value is a number then on little endian machines the value needs to be converted to:
     *
     *      dst[0]     |    dst[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  d e f g h i j k|0 0 0 0 0 a b c
     *
     * Note that endian conversion does not happen within this function but happens in the functions that call
     * read_bits().
     *
     * In theory we could also implement support for bitdata stored in lsb (least significant bit) to msb order.
     * However, such a feature is currently NOT implemented!
     * If we ever implement such a feature it should look like this:
     * If the format of the source is (note the reverse order in which we display the bits!):
     *
     *      src[0]     |    src[1]
     *  0 1 2 3 4 5 6 7|0 1 2 3 4 5 6 7
     *  . . a b c d e f|g h i j k . . .
     *
     * then this will be read as
     *
     *      tmp[0]     |    tmp[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  f e d c b a . .|. . . k j i h g
     *
     * we can then perform a shift of bits (shifting 2 least significant bits from the right byte to the left byte)
     * to get the little endian result
     *
     *      dst[0]     |    dst[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  h g f e d c b a|. . . . . k j i
     *
     * On big endian machines this can then be turned into a big endian number
     *
     *      dst[0]     |    dst[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  0 0 0 0 0 k j i|h g f e d c b a
     */

    /* The padded bit length is the number of 'padding' bits plus the bit length.
     * The 'padding' bits are the bits between the start of byte (i.e. starting at the most significant bit) and the
     * start of requested bits (in the (big endian) example above, bits 7 and 6 of src[0] are the padding bits).
     */
    padded_bit_length = (bit_offset & 0x7) + bit_length;
    bit_shift = (unsigned long)(-padded_bit_length & 0x7);
    if (padded_bit_length <= 8)
    {
        /* all bits are located within a single byte, so we will use an optimized approach to extract the bits */
        if (read_bytes(product, bit_offset >> 3, 1, dst) != 0)
        {
            return -1;
        }
        if (bit_shift != 0)
        {
            *dst >>= bit_shift;
        }
        if ((bit_length & 0x7) != 0)
        {
            *dst &= ((1 << bit_length) - 1);
        }
    }
    else if (bit_shift == 0)
    {
        /* no shifting needed for the source bytes */
        if (bit_length & 0x7)
        {
            unsigned long trailing_bit_length;
            uint8_t buffer;

            /* the first byte contains trailing bits and is not copied in full */
            if (read_bytes(product, bit_offset >> 3, 1, &buffer) != 0)
            {
                return -1;
            }
            trailing_bit_length = (unsigned long)(bit_length & 0x7);
            *dst = buffer & ((1 << trailing_bit_length) - 1);
            dst++;
            bit_offset += trailing_bit_length;
            bit_length -= trailing_bit_length;
        }
        if (bit_length > 0)
        {
            /* use a plain copy for the remaining bytes */
            if (read_bytes(product, bit_offset >> 3, bit_length >> 3, dst) != 0)
            {
                return -1;
            }
        }
    }
    else
    {
        uint8_t buffer[4];
        union
        {
            uint8_t as_bytes[4];
            uint32_t as_uint32;
        } data;

        /* we need to shift each byte */

        /* we first copy the part modulo 24 bits (so the rest can be processed in chuncks of 24 bits each) */
        if (bit_length % 24 != 0)
        {
            unsigned long mod24_bit_length;
            unsigned long num_bytes_read;
            unsigned long num_bytes_set;
            unsigned long i;

            mod24_bit_length = (unsigned long)(bit_length % 24);
            num_bytes_read = bit_size_to_byte_size(((unsigned long)(bit_offset & 0x7)) + mod24_bit_length);
            num_bytes_set = bit_size_to_byte_size(mod24_bit_length);
            if (read_bytes(product, bit_offset >> 3, num_bytes_read, buffer) != 0)
            {
                return -1;
            }
            data.as_uint32 = 0;
            for (i = 0; i < num_bytes_read; i++)
            {
#ifdef WORDS_BIGENDIAN
                data.as_bytes[i] = buffer[i];
#else
                data.as_bytes[3 - i] = buffer[i];
#endif
            }
            data.as_uint32 = (data.as_uint32 >> (bit_shift + 8 * (4 - num_bytes_read))) & ((1 << mod24_bit_length) - 1);
            for (i = 0; i < num_bytes_set; i++)
            {
#ifdef WORDS_BIGENDIAN
                dst[i] = data.as_bytes[(4 - num_bytes_set) + i];
#else
                dst[i] = data.as_bytes[(num_bytes_set - 1) - i];
#endif
            }
            dst += num_bytes_set;
            bit_offset += mod24_bit_length;
            bit_length -= mod24_bit_length;
        }

        /* we copy the remaining data in chunks of 24 bits (3 bytes) at a time */
        while (bit_length > 0)
        {
#ifdef WORDS_BIGENDIAN
            if (read_bytes(product, bit_offset >> 3, 4, data.as_bytes) != 0)
            {
                return -1;
            }
            data.as_uint32 >>= bit_shift;
            dst[0] = data.as_bytes[1];
            dst[1] = data.as_bytes[2];
            dst[2] = data.as_bytes[3];
#else
            if (read_bytes(product, bit_offset >> 3, 4, buffer) != 0)
            {
                return -1;
            }
            data.as_bytes[0] = buffer[3];
            data.as_bytes[1] = buffer[2];
            data.as_bytes[2] = buffer[1];
            data.as_bytes[3] = buffer[0];
            data.as_uint32 >>= bit_shift;
            dst[0] = data.as_bytes[2];
            dst[1] = data.as_bytes[1];
            dst[2] = data.as_bytes[0];
#endif
            dst += 3;
            bit_offset += 24;
            bit_length -= 24;
        }
    }

    return 0;
}